

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  ImVec2 IVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < num_segments) {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = p1->x;
    auVar10._4_4_ = p1->y;
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar5 = 3.4028235e+38;
    iVar2 = 1;
    do {
      IVar4 = ImBezierCalc(p1,p2,p3,p4,(float)iVar2 * (1.0 / (float)num_segments));
      local_48 = auVar10._0_4_;
      fStack_44 = auVar10._4_4_;
      fStack_40 = auVar10._8_4_;
      fStack_3c = auVar10._12_4_;
      fVar8 = IVar4.x - local_48;
      fVar11 = IVar4.y - fStack_44;
      fVar12 = (p->x - local_48) * fVar8 + (p->y - fStack_44) * fVar11;
      fVar14 = local_48;
      fVar15 = fStack_44;
      if ((0.0 <= fVar12) &&
         (fVar13 = fVar8 * fVar8 + fVar11 * fVar11, fVar14 = IVar4.x, fVar15 = IVar4.y,
         fVar12 <= fVar13)) {
        auVar9._0_4_ = fVar8 * fVar12;
        auVar9._4_4_ = fVar11 * fVar12;
        auVar9._8_4_ = (extraout_XMM0_Dc - fStack_40) * fVar12;
        auVar9._12_4_ = (extraout_XMM0_Dd - fStack_3c) * fVar12;
        auVar1._4_4_ = fVar13;
        auVar1._0_4_ = fVar13;
        auVar1._8_4_ = fVar13;
        auVar1._12_4_ = fVar13;
        auVar10 = divps(auVar9,auVar1);
        fVar14 = local_48 + auVar10._0_4_;
        fVar15 = fStack_44 + auVar10._4_4_;
      }
      fVar8 = p->x - fVar14;
      fVar11 = p->y - fVar15;
      fVar8 = fVar8 * fVar8 + fVar11 * fVar11;
      if (fVar5 <= fVar8) {
        fVar8 = fVar5;
        fVar15 = fVar7;
        fVar14 = fVar6;
      }
      fVar6 = fVar14;
      fVar7 = fVar15;
      auVar10._8_4_ = extraout_XMM0_Dc;
      auVar10._0_4_ = IVar4.x;
      auVar10._4_4_ = IVar4.y;
      auVar10._12_4_ = extraout_XMM0_Dd;
      bVar3 = iVar2 != num_segments;
      fVar5 = fVar8;
      iVar2 = iVar2 + 1;
    } while (bVar3);
    IVar4.y = fVar7;
    IVar4.x = fVar6;
    return IVar4;
  }
  __assert_fail("num_segments > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.cpp"
                ,0x45f,
                "ImVec2 ImBezierClosestPoint(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, int)"
               );
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}